

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lest_cpp03.hpp
# Opt level: O1

string * __thiscall
lest::to_string<nonstd::optional_lite::optional<char>,nonstd::optional_lite::optional<long>>
          (string *__return_storage_ptr__,lest *this,optional<char> *lhs,string *op,
          optional<long> *rhs)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  ostream *poVar2;
  optional<char> *value;
  optional<long> *value_00;
  ostringstream os;
  string local_208;
  size_type *local_1e8;
  size_type local_1e0;
  size_type local_1d8;
  undefined8 uStack_1d0;
  size_type *local_1c8;
  size_type local_1c0;
  size_type local_1b8;
  undefined8 uStack_1b0;
  ostringstream local_1a8 [112];
  ios_base local_138 [264];
  
  std::__cxx11::ostringstream::ostringstream(local_1a8);
  string_maker<nonstd::optional_lite::optional<char>>::to_string_abi_cxx11_
            (&local_208,(string_maker<nonstd::optional_lite::optional<char>> *)this,value);
  paVar1 = &local_208.field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_208._M_dataplus._M_p == paVar1) {
    uStack_1b0 = local_208.field_2._8_8_;
    local_1c8 = &local_1b8;
  }
  else {
    local_1c8 = (size_type *)local_208._M_dataplus._M_p;
  }
  local_1b8 = local_208.field_2._M_allocated_capacity;
  local_1c0 = local_208._M_string_length;
  poVar2 = std::__ostream_insert<char,std::char_traits<char>>
                     ((ostream *)local_1a8,(char *)local_1c8,local_208._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar2," ",1);
  poVar2 = std::__ostream_insert<char,std::char_traits<char>>
                     (poVar2,*(char **)lhs,*(long *)(lhs + 4));
  std::__ostream_insert<char,std::char_traits<char>>(poVar2," ",1);
  string_maker<nonstd::optional_lite::optional<long>>::to_string_abi_cxx11_
            (&local_208,(string_maker<nonstd::optional_lite::optional<long>> *)op,value_00);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_208._M_dataplus._M_p == paVar1) {
    uStack_1d0 = local_208.field_2._8_8_;
    local_1e8 = &local_1d8;
  }
  else {
    local_1e8 = (size_type *)local_208._M_dataplus._M_p;
  }
  local_1d8 = local_208.field_2._M_allocated_capacity;
  local_1e0 = local_208._M_string_length;
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar2,(char *)local_1e8,local_208._M_string_length);
  if (local_1e8 != &local_1d8) {
    operator_delete(local_1e8,local_1d8 + 1);
  }
  if (local_1c8 != &local_1b8) {
    operator_delete(local_1c8,local_1b8 + 1);
  }
  std::__cxx11::ostringstream::str();
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_208._M_dataplus._M_p == paVar1) {
    (__return_storage_ptr__->field_2)._M_allocated_capacity =
         local_208.field_2._M_allocated_capacity;
    *(undefined8 *)((long)&__return_storage_ptr__->field_2 + 8) = local_208.field_2._8_8_;
  }
  else {
    (__return_storage_ptr__->_M_dataplus)._M_p = local_208._M_dataplus._M_p;
    (__return_storage_ptr__->field_2)._M_allocated_capacity =
         local_208.field_2._M_allocated_capacity;
  }
  __return_storage_ptr__->_M_string_length = local_208._M_string_length;
  std::__cxx11::ostringstream::~ostringstream(local_1a8);
  std::ios_base::~ios_base(local_138);
  return __return_storage_ptr__;
}

Assistant:

std::string to_string( L const & lhs, std::string op, R const & rhs )
{
    std::ostringstream os; os << to_string( lhs ) << " " << op << " " << to_string( rhs ); return os.str();
}